

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingFetchRow<unsigned_char>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  unsigned_long skip_count;
  uchar multiplier;
  BitpackingScanState<unsigned_char,_signed_char> scan_state;
  uint8_t local_871;
  BitpackingScanState<unsigned_char,_signed_char> local_870;
  
  BitpackingScanState<unsigned_char,_signed_char>::BitpackingScanState(&local_870,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  BitpackingScanState<unsigned_char,_signed_char>::Skip(&local_870,segment,skip_count);
  pdVar1 = result->data;
  if (local_870.current_group.mode == CONSTANT_DELTA) {
    TryCast::Operation<unsigned_long,unsigned_char>(local_870.current_group_offset,&local_871,false)
    ;
    local_870.current_constant =
         local_870.current_constant * local_871 + local_870.current_frame_of_reference;
  }
  else if (local_870.current_group.mode != CONSTANT) {
    duckdb_fastpforlib::fastunpack
              (local_870.current_group_ptr +
               ((ulong)local_870.current_width *
                (local_870.current_group_offset & 0xffffffffffffffe0) >> 3),
               local_870.decompression_buffer,(uint)local_870.current_width);
    local_870.current_constant =
         local_870.decompression_buffer[(uint)local_870.current_group_offset & 0x1f];
    pdVar1[result_idx] = local_870.current_constant;
    local_870.current_constant = local_870.current_constant + local_870.current_frame_of_reference;
    pdVar1[result_idx] = local_870.current_constant;
    if (local_870.current_group.mode != DELTA_FOR) goto LAB_01a442e2;
    local_870.current_constant = local_870.current_constant + local_870.current_delta_offset;
  }
  pdVar1[result_idx] = local_870.current_constant;
LAB_01a442e2:
  BitpackingScanState<unsigned_char,_signed_char>::~BitpackingScanState(&local_870);
  return;
}

Assistant:

void BitpackingFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                        idx_t result_idx) {
	BitpackingScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	D_ASSERT(scan_state.current_group_offset < BITPACKING_METADATA_GROUP_SIZE);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	T *result_data = FlatVector::GetData<T>(result);
	T *current_result_ptr = result_data + result_idx;

	idx_t offset_in_compression_group =
	    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	data_ptr_t decompression_group_start_pointer =
	    scan_state.current_group_ptr +
	    (scan_state.current_group_offset - offset_in_compression_group) * scan_state.current_width / 8;

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
		*current_result_ptr = scan_state.current_constant;
		return;
	}

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
		T multiplier;
		auto cast = TryCast::Operation<idx_t, T>(scan_state.current_group_offset, multiplier);
		(void)cast;
		D_ASSERT(cast);
#ifdef DEBUG
		// overflow check
		T result;
		bool multiply = TryMultiplyOperator::Operation(multiplier, scan_state.current_constant, result);
		bool add = TryAddOperator::Operation(result, scan_state.current_frame_of_reference, result);
		D_ASSERT(multiply && add);
#endif
		*current_result_ptr = (multiplier * scan_state.current_constant) + scan_state.current_frame_of_reference;
		return;
	}

	D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
	         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

	BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
	                                     decompression_group_start_pointer, scan_state.current_width, skip_sign_extend);

	*current_result_ptr = scan_state.decompression_buffer[offset_in_compression_group];
	*current_result_ptr += scan_state.current_frame_of_reference;

	if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
		*current_result_ptr += scan_state.current_delta_offset;
	}
}